

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O0

uint ClownLZSS::Internal::Gba::ReadHeader<std::ifstream>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input_local;
  
  InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>::
  Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        *)input);
  bVar1 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)input);
  bVar2 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)input);
  bVar3 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)input);
  return (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000;
}

Assistant:

unsigned int ReadHeader(DecompressorInput<T> &input)
			{
				input.Read(); // Skip compression type byte
				return input.Read() + (input.Read() << 8) + (input.Read() << 16);
			}